

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void writeBits(LodePNGBitWriter *writer,uint value,size_t nbits)

{
  uchar *puVar1;
  uint uVar2;
  long lVar3;
  size_t local_28;
  size_t i;
  size_t nbits_local;
  uint value_local;
  LodePNGBitWriter *writer_local;
  
  if (nbits == 1) {
    if ((writer->bp & 7) == 0) {
      uVar2 = ucvector_resize(writer->data,writer->data->size + 1);
      if (uVar2 == 0) {
        return;
      }
      writer->data->data[writer->data->size - 1] = '\0';
    }
    puVar1 = writer->data->data;
    lVar3 = writer->data->size - 1;
    puVar1[lVar3] = puVar1[lVar3] | (byte)(value << (writer->bp & 7));
    writer->bp = writer->bp + '\x01';
  }
  else {
    for (local_28 = 0; local_28 != nbits; local_28 = local_28 + 1) {
      if ((writer->bp & 7) == 0) {
        uVar2 = ucvector_resize(writer->data,writer->data->size + 1);
        if (uVar2 == 0) {
          return;
        }
        writer->data->data[writer->data->size - 1] = '\0';
      }
      puVar1 = writer->data->data;
      lVar3 = writer->data->size - 1;
      puVar1[lVar3] =
           puVar1[lVar3] | (byte)((value >> ((byte)local_28 & 0x1f) & 1) << (writer->bp & 7));
      writer->bp = writer->bp + '\x01';
    }
  }
  return;
}

Assistant:

static void writeBits(LodePNGBitWriter* writer, unsigned value, size_t nbits) {
  if(nbits == 1) { /* compiler should statically compile this case if nbits == 1 */
    WRITEBIT(writer, value);
  } else {
    /* TODO: increase output size only once here rather than in each WRITEBIT */
    size_t i;
    for(i = 0; i != nbits; ++i) {
      WRITEBIT(writer, (unsigned char)((value >> i) & 1));
    }
  }
}